

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O0

void ncnn::transpose_pack_A_tile_quantize
               (Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk,Mat *scales)

{
  undefined4 in_R8D;
  undefined4 in_R9D;
  int in_stack_00000b20;
  int in_stack_00000b24;
  int in_stack_00000b28;
  int in_stack_00000b2c;
  Mat *in_stack_00000b30;
  Mat *in_stack_00000b38;
  
  transpose_pack_A_tile_fp32_to_int8
            (in_stack_00000b38,in_stack_00000b30,in_stack_00000b2c,in_stack_00000b28,
             in_stack_00000b24,in_stack_00000b20,(Mat *)CONCAT44(in_R8D,in_R9D));
  return;
}

Assistant:

static void transpose_pack_A_tile_quantize(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk, const Mat& scales)
{
    transpose_pack_A_tile_fp32_to_int8(A, AT, i, max_ii, k, max_kk, scales);
}